

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backend_sdl.cpp
# Opt level: O3

int __thiscall
CGraphicsBackend_SDL_OpenGL::GetVideoModes
          (CGraphicsBackend_SDL_OpenGL *this,CVideoMode *pModes,int MaxModes,int Screen)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  long in_FS_OFFSET;
  SDL_DisplayMode Mode;
  undefined1 local_50 [4];
  int local_4c;
  int local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = SDL_GetNumDisplayModes(Screen);
  if (iVar1 < 0) {
    uVar3 = SDL_GetError();
    uVar6 = 0;
    dbg_msg("gfx","unable to get the number of display modes: %s",uVar3);
  }
  else {
    uVar6 = 0;
    if (0 < MaxModes && iVar1 != 0) {
      iVar5 = 0;
      uVar6 = 0;
      do {
        iVar2 = SDL_GetDisplayMode(Screen,iVar5,local_50);
        if (iVar2 < 0) {
          uVar3 = SDL_GetError();
          dbg_msg("gfx","unable to get display mode: %s",uVar3);
        }
        else {
          if (0 < (int)uVar6) {
            uVar4 = 0;
            do {
              if ((pModes[uVar4].m_Width == local_4c) && (pModes[uVar4].m_Height == local_48))
              goto LAB_0011cf1e;
              uVar4 = uVar4 + 1;
            } while (uVar6 != uVar4);
          }
          pModes[(int)uVar6].m_Width = local_4c;
          pModes[(int)uVar6].m_Height = local_48;
          uVar6 = uVar6 + 1;
        }
LAB_0011cf1e:
        iVar5 = iVar5 + 1;
      } while ((iVar5 < iVar1) && ((int)uVar6 < MaxModes));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return uVar6;
}

Assistant:

int CGraphicsBackend_SDL_OpenGL::GetVideoModes(CVideoMode *pModes, int MaxModes, int Screen)
{
	int NumModes = SDL_GetNumDisplayModes(Screen);
	if(NumModes < 0)
	{
		dbg_msg("gfx", "unable to get the number of display modes: %s", SDL_GetError());
		return 0;
	}

	int ModesCount = 0;
	for(int i = 0; i < NumModes && ModesCount < MaxModes; i++)
	{
		SDL_DisplayMode Mode;
		if(SDL_GetDisplayMode(Screen, i, &Mode) < 0)
		{
			dbg_msg("gfx", "unable to get display mode: %s", SDL_GetError());
			continue;
		}

		bool AlreadyFound = false;
		for(int j = 0; j < ModesCount; j++)
		{
			if(pModes[j].m_Width == Mode.w && pModes[j].m_Height == Mode.h)
			{
				AlreadyFound = true;
				break;
			}
		}
		if(AlreadyFound)
			continue;

		pModes[ModesCount].m_Width = Mode.w;
		pModes[ModesCount].m_Height = Mode.h;
		ModesCount++;
	}
	return ModesCount;
}